

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void destStore64Gray8(QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *buffer,int length)

{
  long lVar1;
  uchar *puVar2;
  quint64 qVar3;
  long lVar4;
  bool bVar5;
  int k;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QColorTransform tf;
  QColorSpace fromCS;
  quint16 gray_line [2048];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = rasterBuffer->m_buffer;
  lVar4 = (long)x + (long)y * rasterBuffer->bytes_per_line;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < length) {
    uVar8 = (ulong)(uint)length;
  }
  while( true ) {
    if (uVar8 == uVar6) goto LAB_005bc669;
    qVar3 = buffer[uVar6].rgba;
    if (((short)qVar3 != (short)(qVar3 >> 0x10)) || ((short)qVar3 != (short)(qVar3 >> 0x20))) break;
    uVar7 = ((uint)qVar3 & 0xffff) + 0x80;
    puVar2[uVar6 + lVar4] = (uchar)(uVar7 - (uVar7 >> 8) >> 8);
    uVar6 = uVar6 + 1;
  }
  fromCS.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QColorSpacePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  bVar5 = QColorSpace::isValid(&rasterBuffer->colorSpace);
  if (bVar5) {
    QColorSpace::QColorSpace(&fromCS,&rasterBuffer->colorSpace);
  }
  else {
    QColorSpace::QColorSpace(&fromCS,SRgb);
  }
  tf.d.d.ptr = (QExplicitlySharedDataPointer<QColorTransformPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QColorSpacePrivate::transformationToXYZ((QColorSpacePrivate *)&tf);
  QColorTransformPrivate::apply<unsigned_short,QRgba64>
            ((QColorTransformPrivate *)tf.d.d.ptr,gray_line,buffer,(long)length,(TransformFlags)0x2)
  ;
  for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    puVar2[uVar6 + lVar4] =
         (uchar)(((uint)gray_line[uVar6] - (gray_line[uVar6] + 0x80 >> 8)) + 0x80 >> 8);
  }
  QColorTransform::~QColorTransform(&tf);
  QColorSpace::~QColorSpace(&fromCS);
LAB_005bc669:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL destStore64Gray8(QRasterBuffer *rasterBuffer, int x, int y, const QRgba64 *buffer, int length)
{
    uchar *data = rasterBuffer->scanLine(y) + x;

    bool failed = false;
    for (int k = 0; k < length; ++k) {
        if (buffer[k].red() != buffer[k].green() || buffer[k].red() != buffer[k].blue()) {
            failed = true;
            break;
        }
        data[k] = buffer[k].red8();
    }
    if (failed) { // Non-gray colors
        QColorSpace fromCS = rasterBuffer->colorSpace.isValid() ? rasterBuffer->colorSpace : QColorSpace::SRgb;
        QColorTransform tf = QColorSpacePrivate::get(fromCS)->transformationToXYZ();
        QColorTransformPrivate *tfd = QColorTransformPrivate::get(tf);

        Q_DECL_UNINITIALIZED quint16 gray_line[BufferSize];
        tfd->apply(gray_line, buffer, length, QColorTransformPrivate::InputPremultiplied);
        for (int k = 0; k < length; ++k)
            data[k] = qt_div_257(gray_line[k]);
    }
}